

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O1

QVariant * __thiscall
QSqlTableModel::headerData
          (QVariant *__return_storage_ptr__,QSqlTableModel *this,int section,Orientation orientation
          ,int role)

{
  QSqlRecord *this_00;
  long lVar1;
  Op OVar2;
  int iVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  QLatin1String QVar5;
  QSqlRecord local_88;
  int local_7c;
  ModifiedRow local_78;
  ModifiedRow local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_7c = section;
  if (orientation == Vertical && role == 0) {
    lVar1 = *(long *)&(this->super_QSqlQueryModel).field_0x8;
    QSqlRecord::QSqlRecord(&local_88);
    this_00 = &local_78.m_rec;
    local_78.m_op = None;
    QSqlRecord::QSqlRecord(this_00);
    QSqlRecord::QSqlRecord(&local_78.m_db_values,&local_88);
    local_78.m_submitted = true;
    local_78.m_insert = false;
    if (local_78.m_op != None) {
      local_78.m_submitted = true;
      local_78.m_insert = false;
      local_78.m_op = None;
      QSqlRecord::operator=(this_00,&local_78.m_db_values);
      OVar2 = local_78.m_op;
      iVar3 = QSqlRecord::count(this_00);
      if (0 < iVar3) {
        iVar3 = iVar3 + 1;
        do {
          QSqlRecord::setGenerated(this_00,iVar3 + -2,OVar2 == Delete);
          iVar3 = iVar3 + -1;
        } while (1 < iVar3);
      }
    }
    QMap<int,_QSqlTableModelPrivate::ModifiedRow>::value
              (&local_58,(QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar1 + 0x2e0),&local_7c,
               &local_78);
    QSqlRecord::~QSqlRecord(&local_58.m_db_values);
    QSqlRecord::~QSqlRecord(&local_58.m_rec);
    QSqlRecord::~QSqlRecord(&local_78.m_db_values);
    QSqlRecord::~QSqlRecord(this_00);
    QSqlRecord::~QSqlRecord(&local_88);
    if (local_58.m_op == Delete) {
      pcVar4 = "!";
    }
    else {
      if (local_58.m_op != Insert) goto LAB_0013aa9a;
      pcVar4 = "*";
    }
    QVar5.m_data = pcVar4;
    QVar5.m_size = 1;
    QVariant::QVariant(__return_storage_ptr__,QVar5);
  }
  else {
LAB_0013aa9a:
    QSqlQueryModel::headerData
              (__return_storage_ptr__,&this->super_QSqlQueryModel,local_7c,orientation,role);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSqlTableModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    Q_D(const QSqlTableModel);
    if (orientation == Qt::Vertical && role == Qt::DisplayRole) {
        const QSqlTableModelPrivate::Op op = d->cache.value(section).op();
        if (op == QSqlTableModelPrivate::Insert)
            return "*"_L1;
        else if (op == QSqlTableModelPrivate::Delete)
            return "!"_L1;
    }
    return QSqlQueryModel::headerData(section, orientation, role);
}